

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::BNLL_x86_avx::forward_inplace(BNLL_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar16 [16];
  float fVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar30;
  undefined1 auVar27 [32];
  float fVar28;
  float fVar29;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    auVar46 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar43 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    do {
      auVar45._8_4_ = 0xc2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar44._8_4_ = 0x42b0c0a5;
      auVar44._0_8_ = 0x42b0c0a542b0c0a5;
      auVar45._12_4_ = 0xc2b0c0a5;
      auVar44._12_4_ = 0x42b0c0a5;
      auVar45._16_4_ = 0xc2b0c0a5;
      auVar44._16_4_ = 0x42b0c0a5;
      auVar45._20_4_ = 0xc2b0c0a5;
      auVar44._20_4_ = 0x42b0c0a5;
      auVar45._24_4_ = 0xc2b0c0a5;
      auVar44._24_4_ = 0x42b0c0a5;
      auVar45._28_4_ = 0xc2b0c0a5;
      auVar44._28_4_ = 0x42b0c0a5;
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar13._8_4_ = 0x80000000;
          auVar13._0_8_ = 0x8000000080000000;
          auVar13._12_4_ = 0x80000000;
          auVar13._16_4_ = 0x80000000;
          auVar13._20_4_ = 0x80000000;
          auVar13._24_4_ = 0x80000000;
          auVar13._28_4_ = 0x80000000;
          auVar13 = vorps_avx(*pauVar9,auVar13);
          auVar13 = vminps_avx(auVar44,auVar13);
          auVar25 = vmaxps_avx(auVar45,auVar13);
          auVar23._0_4_ = auVar46._0_4_ + auVar25._0_4_ * 1.442695;
          auVar23._4_4_ = auVar46._4_4_ + auVar25._4_4_ * 1.442695;
          auVar23._8_4_ = auVar46._8_4_ + auVar25._8_4_ * 1.442695;
          auVar23._12_4_ = auVar46._12_4_ + auVar25._12_4_ * 1.442695;
          auVar23._16_4_ = auVar46._16_4_ + auVar25._16_4_ * 1.442695;
          auVar23._20_4_ = auVar46._20_4_ + auVar25._20_4_ * 1.442695;
          auVar23._24_4_ = auVar46._24_4_ + auVar25._24_4_ * 1.442695;
          auVar23._28_4_ = auVar46._28_4_ + in_ZMM2._28_4_;
          auVar27 = vroundps_avx(auVar23,1);
          auVar13 = vcmpps_avx(auVar23,auVar27,1);
          auVar13 = vandps_avx(auVar47._0_32_,auVar13);
          auVar13 = vsubps_avx(auVar27,auVar13);
          auVar3._4_4_ = auVar13._4_4_ * 0.6931472;
          auVar3._0_4_ = auVar13._0_4_ * 0.6931472;
          auVar3._8_4_ = auVar13._8_4_ * 0.6931472;
          auVar3._12_4_ = auVar13._12_4_ * 0.6931472;
          auVar3._16_4_ = auVar13._16_4_ * 0.6931472;
          auVar3._20_4_ = auVar13._20_4_ * 0.6931472;
          auVar3._24_4_ = auVar13._24_4_ * 0.6931472;
          auVar3._28_4_ = auVar27._28_4_;
          auVar25 = vsubps_avx(auVar25,auVar3);
          fVar15 = auVar25._0_4_;
          fVar28 = auVar25._4_4_;
          fVar29 = auVar25._8_4_;
          fVar30 = auVar25._12_4_;
          fVar31 = auVar25._16_4_;
          fVar32 = auVar25._20_4_;
          fVar33 = auVar25._24_4_;
          auVar16._0_4_ = (int)auVar13._0_4_;
          auVar16._4_4_ = (int)auVar13._4_4_;
          auVar16._8_4_ = (int)auVar13._8_4_;
          auVar16._12_4_ = (int)auVar13._12_4_;
          auVar24._16_4_ = (int)auVar13._16_4_;
          auVar24._0_16_ = auVar16;
          auVar24._20_4_ = (int)auVar13._20_4_;
          auVar24._24_4_ = (int)auVar13._24_4_;
          auVar24._28_4_ = (int)auVar13._28_4_;
          auVar34 = vpslld_avx(auVar16,0x17);
          auVar16 = vpslld_avx(auVar24._16_16_,0x17);
          auVar16 = vpaddd_avx(auVar16,auVar43._0_16_);
          auVar34 = vpaddd_avx(auVar34,auVar43._0_16_);
          auVar14._0_4_ =
               auVar47._0_4_ +
               (auVar47._0_4_ + fVar15 +
               fVar15 * fVar15 *
               (auVar46._0_4_ +
               ((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                0.041665796) * fVar15 + 0.16666666) * fVar15)) * auVar34._0_4_;
          auVar14._4_4_ =
               auVar47._4_4_ +
               (auVar47._4_4_ + fVar28 +
               fVar28 * fVar28 *
               (auVar46._4_4_ +
               ((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                0.041665796) * fVar28 + 0.16666666) * fVar28)) * auVar34._4_4_;
          auVar14._8_4_ =
               auVar47._8_4_ +
               (auVar47._8_4_ + fVar29 +
               fVar29 * fVar29 *
               (auVar46._8_4_ +
               ((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                0.041665796) * fVar29 + 0.16666666) * fVar29)) * auVar34._8_4_;
          auVar14._12_4_ =
               auVar47._12_4_ +
               (auVar47._12_4_ + fVar30 +
               fVar30 * fVar30 *
               (auVar46._12_4_ +
               ((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
                0.041665796) * fVar30 + 0.16666666) * fVar30)) * auVar34._12_4_;
          auVar14._16_4_ =
               auVar47._16_4_ +
               (auVar47._16_4_ + fVar31 +
               fVar31 * fVar31 *
               (auVar46._16_4_ +
               ((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                0.041665796) * fVar31 + 0.16666666) * fVar31)) * auVar16._0_4_;
          auVar14._20_4_ =
               auVar47._20_4_ +
               (auVar47._20_4_ + fVar32 +
               fVar32 * fVar32 *
               (auVar46._20_4_ +
               ((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
                0.041665796) * fVar32 + 0.16666666) * fVar32)) * auVar16._4_4_;
          auVar14._24_4_ =
               auVar47._24_4_ +
               (auVar47._24_4_ + fVar33 +
               fVar33 * fVar33 *
               (auVar46._24_4_ +
               ((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                0.041665796) * fVar33 + 0.16666666) * fVar33)) * auVar16._8_4_;
          auVar14._28_4_ = auVar47._28_4_ + auVar47._28_4_ + auVar25._28_4_ + auVar27._28_4_;
          auVar25._8_4_ = 0x800000;
          auVar25._0_8_ = 0x80000000800000;
          auVar25._12_4_ = 0x800000;
          auVar25._16_4_ = 0x800000;
          auVar25._20_4_ = 0x800000;
          auVar25._24_4_ = 0x800000;
          auVar25._28_4_ = 0x800000;
          auVar27 = vmaxps_avx(auVar14,auVar25);
          auVar16 = vpsrld_avx(auVar27._16_16_,0x17);
          auVar26._8_4_ = 0x807fffff;
          auVar26._0_8_ = 0x807fffff807fffff;
          auVar26._12_4_ = 0x807fffff;
          auVar26._16_4_ = 0x807fffff;
          auVar26._20_4_ = 0x807fffff;
          auVar26._24_4_ = 0x807fffff;
          auVar26._28_4_ = 0x807fffff;
          auVar13 = vandps_avx(auVar27,auVar26);
          auVar3 = vorps_avx(auVar46._0_32_,auVar13);
          auVar42._8_4_ = 0x3f3504f3;
          auVar42._0_8_ = 0x3f3504f33f3504f3;
          auVar42._12_4_ = 0x3f3504f3;
          auVar42._16_4_ = 0x3f3504f3;
          auVar42._20_4_ = 0x3f3504f3;
          auVar42._24_4_ = 0x3f3504f3;
          auVar42._28_4_ = 0x3f3504f3;
          auVar25 = vcmpps_avx(auVar42,auVar3,2);
          auVar13 = vandnps_avx(auVar25,auVar3);
          fVar15 = auVar3._0_4_ + -1.0 + auVar13._0_4_;
          fVar28 = auVar3._4_4_ + -1.0 + auVar13._4_4_;
          fVar29 = auVar3._8_4_ + -1.0 + auVar13._8_4_;
          fVar30 = auVar3._12_4_ + -1.0 + auVar13._12_4_;
          fVar31 = auVar3._16_4_ + -1.0 + auVar13._16_4_;
          fVar32 = auVar3._20_4_ + -1.0 + auVar13._20_4_;
          fVar33 = auVar3._24_4_ + -1.0 + auVar13._24_4_;
          auVar16 = vpsubd_avx(auVar16,auVar25._16_16_);
          auVar43 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          auVar34 = vpsrld_avx(auVar27._0_16_,0x17);
          auVar37._8_4_ = 0xffffff81;
          auVar37._0_8_ = 0xffffff81ffffff81;
          auVar37._12_4_ = 0xffffff81;
          auVar16 = vpaddd_avx(auVar16,auVar37);
          auVar34 = vpsubd_avx(auVar34,auVar25._0_16_);
          auVar34 = vpaddd_avx(auVar34,auVar37);
          auVar38._16_16_ = auVar16;
          auVar38._0_16_ = auVar34;
          auVar25 = vcvtdq2ps_avx(auVar38);
          auVar27._0_4_ =
               auVar25._0_4_ * 0.6931472 + fVar15 +
               fVar15 * fVar15 *
               (((((((((fVar15 * 0.070376836 + -0.1151461) * fVar15 + 0.116769984) * fVar15 +
                     -0.12420141) * fVar15 + 0.14249323) * fVar15 + -0.16668057) * fVar15 +
                  0.20000714) * fVar15 + -0.24999994) * fVar15 + 0.3333333) * fVar15 + -0.5);
          auVar27._4_4_ =
               auVar25._4_4_ * 0.6931472 + fVar28 +
               fVar28 * fVar28 *
               (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                     -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                  0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5);
          auVar27._8_4_ =
               auVar25._8_4_ * 0.6931472 + fVar29 +
               fVar29 * fVar29 *
               (((((((((fVar29 * 0.070376836 + -0.1151461) * fVar29 + 0.116769984) * fVar29 +
                     -0.12420141) * fVar29 + 0.14249323) * fVar29 + -0.16668057) * fVar29 +
                  0.20000714) * fVar29 + -0.24999994) * fVar29 + 0.3333333) * fVar29 + -0.5);
          auVar27._12_4_ =
               auVar25._12_4_ * 0.6931472 + fVar30 +
               fVar30 * fVar30 *
               (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                     -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                  0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5);
          auVar27._16_4_ =
               auVar25._16_4_ * 0.6931472 + fVar31 +
               fVar31 * fVar31 *
               (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) * fVar31 +
                     -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057) * fVar31 +
                  0.20000714) * fVar31 + -0.24999994) * fVar31 + 0.3333333) * fVar31 + -0.5);
          auVar27._20_4_ =
               auVar25._20_4_ * 0.6931472 + fVar32 +
               fVar32 * fVar32 *
               (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                     -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 +
                  0.20000714) * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5);
          auVar27._24_4_ =
               auVar25._24_4_ * 0.6931472 + fVar33 +
               fVar33 * fVar33 *
               (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) * fVar33 +
                     -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057) * fVar33 +
                  0.20000714) * fVar33 + -0.24999994) * fVar33 + 0.3333333) * fVar33 + -0.5);
          auVar27._28_4_ = auVar25._28_4_ + auVar3._28_4_ + -1.0 + auVar13._28_4_ + 0.0;
          in_ZMM2 = ZEXT3264(auVar27);
          auVar13 = vcmpps_avx(auVar14,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar25 = vorps_avx(auVar13,auVar27);
          auVar13 = vmaxps_avx(*pauVar9,ZEXT1232(ZEXT412(0)) << 0x20);
          *(float *)*pauVar9 = auVar25._0_4_ + auVar13._0_4_;
          *(float *)(*pauVar9 + 4) = auVar25._4_4_ + auVar13._4_4_;
          *(float *)(*pauVar9 + 8) = auVar25._8_4_ + auVar13._8_4_;
          *(float *)(*pauVar9 + 0xc) = auVar25._12_4_ + auVar13._12_4_;
          *(float *)(*pauVar9 + 0x10) = auVar25._16_4_ + auVar13._16_4_;
          *(float *)(*pauVar9 + 0x14) = auVar25._20_4_ + auVar13._20_4_;
          *(float *)(*pauVar9 + 0x18) = auVar25._24_4_ + auVar13._24_4_;
          *(float *)(*pauVar9 + 0x1c) = auVar25._28_4_ + auVar13._28_4_;
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      auVar34._8_4_ = 0x3f000000;
      auVar34._0_8_ = 0x3f0000003f000000;
      auVar34._12_4_ = 0x3f000000;
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar16 = vorps_avx(*(undefined1 (*) [16])*pauVar9,auVar11);
        auVar17._8_4_ = 0x42b0c0a5;
        auVar17._0_8_ = 0x42b0c0a542b0c0a5;
        auVar17._12_4_ = 0x42b0c0a5;
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar18._8_4_ = 0xc2b0c0a5;
        auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar18._12_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar16,auVar18);
        auVar19._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
        auVar19._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
        auVar19._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
        auVar19._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
        auVar35._0_4_ = (int)auVar19._0_4_;
        auVar35._4_4_ = (int)auVar19._4_4_;
        auVar35._8_4_ = (int)auVar19._8_4_;
        auVar35._12_4_ = (int)auVar19._12_4_;
        auVar37 = vcvtdq2ps_avx(auVar35);
        auVar16 = vcmpps_avx(auVar19,auVar37,1);
        auVar17 = auVar43._0_16_;
        auVar16 = vandps_avx(auVar16,auVar17);
        auVar16 = vsubps_avx(auVar37,auVar16);
        auVar36._0_4_ = auVar16._0_4_ * 0.6931472;
        auVar36._4_4_ = auVar16._4_4_ * 0.6931472;
        auVar36._8_4_ = auVar16._8_4_ * 0.6931472;
        auVar36._12_4_ = auVar16._12_4_ * 0.6931472;
        auVar37 = vsubps_avx(auVar2,auVar36);
        fVar15 = auVar37._0_4_;
        fVar28 = auVar37._4_4_;
        fVar29 = auVar37._8_4_;
        fVar30 = auVar37._12_4_;
        auVar20._0_4_ = (int)auVar16._0_4_;
        auVar20._4_4_ = (int)auVar16._4_4_;
        auVar20._8_4_ = (int)auVar16._8_4_;
        auVar20._12_4_ = (int)auVar16._12_4_;
        auVar16 = vpslld_avx(auVar20,0x17);
        auVar16 = vpaddd_avx(auVar16,auVar17);
        auVar12._0_4_ =
             (fVar15 + auVar43._0_4_ +
             fVar15 * fVar15 *
             (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
               0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar16._0_4_ + auVar43._0_4_;
        auVar12._4_4_ =
             (fVar28 + auVar43._4_4_ +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar16._4_4_ + auVar43._4_4_;
        auVar12._8_4_ =
             (fVar29 + auVar43._8_4_ +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar16._8_4_ + auVar43._8_4_;
        auVar12._12_4_ =
             (fVar30 + auVar43._12_4_ +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar16._12_4_ +
             auVar43._12_4_;
        auVar21._8_4_ = 0x800000;
        auVar21._0_8_ = 0x80000000800000;
        auVar21._12_4_ = 0x800000;
        auVar16 = vmaxps_avx(auVar12,auVar21);
        auVar37 = vpsrld_avx(auVar16,0x17);
        auVar39._8_4_ = 0xffffff82;
        auVar39._0_8_ = 0xffffff82ffffff82;
        auVar39._12_4_ = 0xffffff82;
        auVar37 = vpaddd_avx(auVar37,auVar39);
        auVar40._8_4_ = 0x807fffff;
        auVar40._0_8_ = 0x807fffff807fffff;
        auVar40._12_4_ = 0x807fffff;
        auVar16 = vandps_avx(auVar16,auVar40);
        auVar11 = vorps_avx(auVar34,auVar16);
        auVar2 = vcvtdq2ps_avx(auVar37);
        auVar41._8_4_ = 0x3f3504f3;
        auVar41._0_8_ = 0x3f3504f33f3504f3;
        auVar41._12_4_ = 0x3f3504f3;
        auVar37 = vcmpps_avx(auVar11,auVar41,1);
        auVar16 = vandps_avx(auVar37,auVar11);
        fVar15 = auVar11._0_4_ + -1.0 + auVar16._0_4_;
        fVar28 = auVar11._4_4_ + -1.0 + auVar16._4_4_;
        fVar29 = auVar11._8_4_ + -1.0 + auVar16._8_4_;
        fVar30 = auVar11._12_4_ + -1.0 + auVar16._12_4_;
        auVar16 = vandps_avx(auVar37,auVar17);
        auVar16 = vsubps_avx(auVar2,auVar16);
        auVar22._0_4_ =
             auVar16._0_4_ * 0.6931472 + fVar15 +
             fVar15 * fVar15 *
             (((((((((fVar15 * 0.070376836 + -0.1151461) * fVar15 + 0.116769984) * fVar15 +
                   -0.12420141) * fVar15 + 0.14249323) * fVar15 + -0.16668057) * fVar15 + 0.20000714
                ) * fVar15 + -0.24999994) * fVar15 + 0.3333333) * fVar15 + -0.5);
        auVar22._4_4_ =
             auVar16._4_4_ * 0.6931472 + fVar28 +
             fVar28 * fVar28 *
             (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                   -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 + 0.20000714
                ) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5);
        auVar22._8_4_ =
             auVar16._8_4_ * 0.6931472 + fVar29 +
             fVar29 * fVar29 *
             (((((((((fVar29 * 0.070376836 + -0.1151461) * fVar29 + 0.116769984) * fVar29 +
                   -0.12420141) * fVar29 + 0.14249323) * fVar29 + -0.16668057) * fVar29 + 0.20000714
                ) * fVar29 + -0.24999994) * fVar29 + 0.3333333) * fVar29 + -0.5);
        auVar22._12_4_ =
             auVar16._12_4_ * 0.6931472 + fVar30 +
             fVar30 * fVar30 *
             (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                   -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 + 0.20000714
                ) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5);
        in_ZMM2 = ZEXT1664(auVar22);
        auVar2._12_4_ = 0;
        auVar2._0_12_ = ZEXT412(0);
        auVar16 = vcmpps_avx(auVar12,auVar2 << 0x20,2);
        auVar37 = vorps_avx(auVar16,auVar22);
        auVar16 = vmaxps_avx(*(undefined1 (*) [16])*pauVar9,auVar2 << 0x20);
        *(float *)*pauVar9 = auVar37._0_4_ + auVar16._0_4_;
        *(float *)(*pauVar9 + 4) = auVar37._4_4_ + auVar16._4_4_;
        *(float *)(*pauVar9 + 8) = auVar37._8_4_ + auVar16._8_4_;
        *(float *)(*pauVar9 + 0xc) = auVar37._12_4_ + auVar16._12_4_;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          fVar15 = *(float *)(*pauVar9 + lVar10 * 4);
          if (fVar15 <= 0.0) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar15 = expf(fVar15);
            fVar28 = logf(fVar15 + 1.0);
          }
          else {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar28 = expf(-fVar15);
            fVar28 = logf(fVar28 + 1.0);
            fVar28 = fVar28 + fVar15;
          }
          *(float *)(*pauVar9 + lVar10 * 4) = fVar28;
          lVar10 = lVar10 + 1;
          auVar46 = ZEXT3264(CONCAT428(0x3f000000,
                                       CONCAT424(0x3f000000,
                                                 CONCAT420(0x3f000000,
                                                           CONCAT416(0x3f000000,
                                                                     CONCAT412(0x3f000000,
                                                                               CONCAT48(0x3f000000,
                                                                                                                                                                                
                                                  0x3f0000003f000000)))))));
          auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar43 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int BNLL_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}